

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O1

void canvas_pop(_glist *x,t_floatarg fvis)

{
  t_symbol *s;
  t_gotfn p_Var1;
  
  if (((*(ushort *)&x->field_0xe8 & 0x101) != 0x100) && (sys_zoom_open == 2)) {
    s = gensym("zoom");
    p_Var1 = zgetfn((t_pd *)x,s);
    if (p_Var1 != (t_gotfn)0x0) {
      (*p_Var1)(x,0x40000000);
    }
  }
  if ((fvis != 0.0) || (NAN(fvis))) {
    canvas_vis(x,1.0);
  }
  pd_popsym((t_pd *)x);
  canvas_resortinlets(x);
  canvas_resortoutlets(x);
  x->field_0xe8 = x->field_0xe8 & 0xf7;
  return;
}

Assistant:

static void canvas_pop(t_canvas *x, t_floatarg fvis)
{
    if (glist_istoplevel(x) && (sys_zoom_open == 2))
    {
        t_zoomfn zoommethod = (t_zoomfn)zgetfn(&x->gl_pd, gensym("zoom"));
        if (zoommethod)
            (*zoommethod)(&x->gl_pd, (t_floatarg)2);
    }
    if (fvis != 0)
        canvas_vis(x, 1);
    pd_popsym(&x->gl_pd);
    canvas_resortinlets(x);
    canvas_resortoutlets(x);
    x->gl_loading = 0;
}